

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O2

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiMaterial>::~TempArray
          (TempArray<std::vector,_aiMaterial> *this)

{
  pointer ppaVar1;
  aiMaterial *this_00;
  mywrap *__range3;
  pointer ppaVar2;
  
  ppaVar1 = (this->arr).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar2 = (this->arr).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar2 != ppaVar1; ppaVar2 = ppaVar2 + 1) {
    this_00 = *ppaVar2;
    if (this_00 != (aiMaterial *)0x0) {
      aiMaterial::~aiMaterial(this_00);
    }
    operator_delete(this_00);
  }
  ::std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
            ((_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }